

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int dorevert(void)

{
  undo_rec *rec;
  undo_rec *puVar1;
  anon_struct_16_2_4dd83919_for_next *paVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  char *fmt;
  buffer *pbVar6;
  
  iVar3 = access(curbp->b_fname,4);
  pbVar6 = curbp;
  if (iVar3 == 0) {
    iVar3 = curwp->w_dotline;
    curbp->b_flag = curbp->b_flag & 0xfe;
    while (rec = (pbVar6->b_undo).tqh_first, rec != (undo_rec *)0x0) {
      puVar1 = (rec->next).tqe_next;
      paVar2 = &puVar1->next;
      if (puVar1 == (undo_rec *)0x0) {
        paVar2 = (anon_struct_16_2_4dd83919_for_next *)&pbVar6->b_undo;
      }
      paVar2->tqe_prev = (rec->next).tqe_prev;
      *(rec->next).tqe_prev = puVar1;
      free_undo_record(rec);
      pbVar6 = curbp;
    }
    iVar4 = readin(pbVar6->b_fname);
    if (iVar4 != 0) {
      iVar3 = setlineno(iVar3);
      return iVar3;
    }
  }
  else {
    dobeep();
    piVar5 = __errno_location();
    if (*piVar5 == 2) {
      fmt = "File %s no longer exists!";
    }
    else {
      fmt = "File %s is no longer readable!";
    }
    ewprintf(fmt,curbp->b_fname);
  }
  return 0;
}

Assistant:

int
dorevert(void)
{
	int lineno;
	struct undo_rec *rec;

	if (access(curbp->b_fname, F_OK|R_OK) != 0) {
		dobeep();
		if (errno == ENOENT)
			ewprintf("File %s no longer exists!",
			    curbp->b_fname);
		else
			ewprintf("File %s is no longer readable!",
			    curbp->b_fname);
		return (FALSE);
	}

	/* Save our current line, so we can go back after reloading. */
	lineno = curwp->w_dotline;

	/* Prevent readin from asking if we want to kill the buffer. */
	curbp->b_flag &= ~BFCHG;

	/* Clean up undo memory */
	while ((rec = TAILQ_FIRST(&curbp->b_undo))) {
		TAILQ_REMOVE(&curbp->b_undo, rec, next);
		free_undo_record(rec);
	}

	if (readin(curbp->b_fname))
		return(setlineno(lineno));
	return (FALSE);
}